

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_inlines_b.h
# Opt level: O1

void arena_sdalloc_no_tcache(tsdn_t *tsdn,void *ptr,size_t size)

{
  uint uVar1;
  ulong uVar2;
  ulong extraout_RDX;
  
  if (size < 0x1001) {
    uVar2 = size + 7 >> 3;
    uVar1 = (uint)duckdb_je_sz_size2index_tab[uVar2];
  }
  else {
    uVar1 = sz_size2index_compute(size);
    uVar2 = extraout_RDX;
  }
  if (uVar1 < 0x24) {
    duckdb_je_arena_dalloc_small(tsdn,ptr);
    return;
  }
  arena_dalloc_large_no_tcache(tsdn,ptr,(szind_t)uVar2);
  return;
}

Assistant:

static inline void
arena_sdalloc_no_tcache(tsdn_t *tsdn, void *ptr, size_t size) {
	assert(ptr != NULL);
	assert(size <= SC_LARGE_MAXCLASS);

	emap_alloc_ctx_t alloc_ctx;
	if (!config_prof || !opt_prof) {
		/*
		 * There is no risk of being confused by a promoted sampled
		 * object, so base szind and slab on the given size.
		 */
		alloc_ctx.szind = sz_size2index(size);
		alloc_ctx.slab = (alloc_ctx.szind < SC_NBINS);
	}

	if ((config_prof && opt_prof) || config_debug) {
		emap_alloc_ctx_lookup(tsdn, &arena_emap_global, ptr,
		    &alloc_ctx);

		assert(alloc_ctx.szind == sz_size2index(size));
		assert((config_prof && opt_prof)
		    || alloc_ctx.slab == (alloc_ctx.szind < SC_NBINS));

		if (config_debug) {
			edata_t *edata = emap_edata_lookup(tsdn,
			    &arena_emap_global, ptr);
			assert(alloc_ctx.szind == edata_szind_get(edata));
			assert(alloc_ctx.slab == edata_slab_get(edata));
		}
	}

	if (likely(alloc_ctx.slab)) {
		/* Small allocation. */
		arena_dalloc_small(tsdn, ptr);
	} else {
		arena_dalloc_large_no_tcache(tsdn, ptr, alloc_ctx.szind);
	}
}